

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

void __thiscall
Compiler::writeSymTabWarnings
          (Compiler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *warnings)

{
  pointer pbVar1;
  long *plVar2;
  ostream *poVar3;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *warning;
  pointer pbVar5;
  string fileName;
  ofstream stream;
  long *local_280;
  long local_278;
  long local_270;
  long lStack_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string local_240;
  long local_220;
  filebuf local_218 [240];
  ios_base local_128 [264];
  
  if ((warnings->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (warnings->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    extractFileName_abi_cxx11_(&local_240,this);
    std::operator+(&local_260,"Output/",&local_240);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_260);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_270 = *plVar4;
      lStack_268 = plVar2[3];
      local_280 = &local_270;
    }
    else {
      local_270 = *plVar4;
      local_280 = (long *)*plVar2;
    }
    local_278 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::ofstream::ofstream(&local_220,(string *)&local_280,_S_out);
    if (local_280 != &local_270) {
      operator_delete(local_280,local_270 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_220,
               "============================ SYMBOL TABLE WARNINGS ========================= \n",
               0x4e);
    pbVar5 = (warnings->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (warnings->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar5 != pbVar1) {
      do {
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_220,(pbVar5->_M_dataplus)._M_p,
                            pbVar5->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        pbVar5 = pbVar5 + 1;
      } while (pbVar5 != pbVar1);
    }
    std::ofstream::close();
    local_220 = _VTT;
    *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
    std::filebuf::~filebuf(local_218);
    std::ios_base::~ios_base(local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void Compiler::writeSymTabWarnings(const std::vector<std::string> &warnings) {
    if (warnings.empty()) return;
    std::string fileName = extractFileName();
    std::ofstream stream("Output/" + fileName + "_symtab_warnings.txt");
    stream << "============================ SYMBOL TABLE WARNINGS ========================= \n";
    for (const auto & warning : warnings) stream << warning << "\n";
    stream.close();
}